

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall
helics::TimeDependencies::checkIfReadyForExecEntry
          (TimeDependencies *this,bool iterating,bool waiting)

{
  DependencyInfo *pDVar1;
  pointer pDVar2;
  bool bVar3;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var4;
  DependencyInfo *pDVar5;
  pointer pDVar6;
  long lVar7;
  pointer pDVar8;
  undefined7 in_register_00000031;
  long lVar9;
  DependencyInfo *pDVar10;
  
  if ((int)CONCAT71(in_register_00000031,iterating) != 0) {
    pDVar5 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (this->dependencies).
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (waiting) {
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,__gnu_cxx::__ops::_Iter_negate<bool(*)(helics::DependencyInfo_const&)>>
                        (pDVar5,pDVar1,iteratingWaitingDependencyCheck);
      return _Var4._M_current == pDVar1;
    }
    lVar9 = (long)pDVar1 - (long)pDVar5;
    lVar7 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
    if (0 < lVar7) {
      lVar9 = lVar7 + 1;
      pDVar10 = pDVar5 + 2;
      do {
        if ((pDVar10[-2].dependency == true) &&
           (pDVar10[-2].super_TimeData.mTimeState == initialized)) {
          pDVar10 = pDVar10 + -2;
          goto LAB_003555ed;
        }
        if ((pDVar10[-1].dependency == true) &&
           (pDVar10[-1].super_TimeData.mTimeState == initialized)) {
          pDVar10 = pDVar10 + -1;
          goto LAB_003555ed;
        }
        if ((pDVar10->dependency == true) && ((pDVar10->super_TimeData).mTimeState == initialized))
        goto LAB_003555ed;
        if ((pDVar10[1].dependency == true) && (pDVar10[1].super_TimeData.mTimeState == initialized)
           ) {
          pDVar10 = pDVar10 + 1;
          goto LAB_003555ed;
        }
        lVar9 = lVar9 + -1;
        pDVar10 = pDVar10 + 4;
      } while (1 < lVar9);
      lVar9 = (long)pDVar1 - (long)(pDVar5 + lVar7 * 4);
      pDVar5 = pDVar5 + lVar7 * 4;
    }
    lVar7 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
    if (lVar7 != 1) {
      if (lVar7 != 2) {
        pDVar10 = pDVar1;
        if ((lVar7 != 3) ||
           ((pDVar5->dependency == true &&
            (pDVar10 = pDVar5, (pDVar5->super_TimeData).mTimeState == initialized))))
        goto LAB_003555ed;
        pDVar5 = pDVar5 + 1;
      }
      if ((pDVar5->dependency == true) &&
         (pDVar10 = pDVar5, (pDVar5->super_TimeData).mTimeState == initialized)) goto LAB_003555ed;
      pDVar5 = pDVar5 + 1;
    }
    pDVar10 = pDVar1;
    if ((pDVar5->super_TimeData).mTimeState == initialized) {
      pDVar10 = pDVar5;
    }
    if (pDVar5->dependency == false) {
      pDVar10 = pDVar1;
    }
LAB_003555ed:
    return pDVar10 == pDVar1;
  }
  if (waiting) {
    bVar3 = checkIfAllDependenciesArePastExec(this,false);
    return bVar3;
  }
  pDVar6 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pDVar2 - (long)pDVar6;
  lVar7 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  if (0 < lVar7) {
    lVar9 = lVar7 + 1;
    pDVar8 = pDVar6 + 2;
    do {
      if (((pDVar8[-2].dependency == true) &&
          (pDVar8[-2].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar8[-2].connection != SELF)) {
        pDVar8 = pDVar8 + -2;
        goto LAB_003555d1;
      }
      if (((pDVar8[-1].dependency == true) &&
          (pDVar8[-1].super_TimeData.mTimeState < exec_requested)) &&
         (pDVar8[-1].connection != SELF)) {
        pDVar8 = pDVar8 + -1;
        goto LAB_003555d1;
      }
      if (((pDVar8->dependency == true) && ((pDVar8->super_TimeData).mTimeState < exec_requested))
         && (pDVar8->connection != SELF)) goto LAB_003555d1;
      if (((pDVar8[1].dependency == true) && (pDVar8[1].super_TimeData.mTimeState < exec_requested))
         && (pDVar8[1].connection != SELF)) {
        pDVar8 = pDVar8 + 1;
        goto LAB_003555d1;
      }
      lVar9 = lVar9 + -1;
      pDVar8 = pDVar8 + 4;
    } while (1 < lVar9);
    lVar9 = (long)pDVar2 - (long)(pDVar6 + lVar7 * 4);
    pDVar6 = pDVar6 + lVar7 * 4;
  }
  lVar7 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pDVar8 = pDVar2;
      if ((lVar7 != 3) ||
         (((pDVar6->dependency == true && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
          (pDVar8 = pDVar6, pDVar6->connection != SELF)))) goto LAB_003555d1;
      pDVar6 = pDVar6 + 1;
    }
    if (((pDVar6->dependency == true) && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
       (pDVar8 = pDVar6, pDVar6->connection != SELF)) goto LAB_003555d1;
    pDVar6 = pDVar6 + 1;
  }
  pDVar8 = pDVar2;
  if (((pDVar6->dependency == true) && ((pDVar6->super_TimeData).mTimeState < exec_requested)) &&
     (pDVar8 = pDVar6, pDVar6->connection == SELF)) {
    pDVar8 = pDVar2;
  }
LAB_003555d1:
  return pDVar8 == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfReadyForExecEntry(bool iterating, bool waiting) const
{
    if (iterating) {
        if (waiting) {
            return std::all_of(dependencies.begin(),
                               dependencies.end(),
                               iteratingWaitingDependencyCheck);
        }
        return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
            return (dep.dependency && dep.mTimeState == TimeState::initialized);
        });
    }
    if (waiting) {
        return checkIfAllDependenciesArePastExec(false);
    }
    return std::none_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency &&
                (!(dep.mTimeState >= TimeState::exec_requested ||
                   (dep.connection == ConnectionType::SELF &&
                    dep.mTimeState >= TimeState::initialized))));
    });
}